

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool Json::parseFromStream(Factory *fact,istream *sin,Value *root,string *errs)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  string doc;
  ostringstream ssin;
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  long *plVar3;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::ostream::operator<<(local_1a0,*(streambuf **)(sin + *(long *)(*(long *)sin + -0x18) + 0xe8));
  std::__cxx11::stringbuf::str();
  iVar2 = (*fact->_vptr_Factory[2])(fact);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  uVar1 = (**(code **)(*plVar3 + 0x10))(plVar3,local_1c0,local_1c0 + local_1b8,root,errs);
  (**(code **)(*plVar3 + 8))(plVar3);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return (bool)uVar1;
}

Assistant:

bool parseFromStream(
    CharReader::Factory const& fact, std::istream& sin,
    Value* root, std::string* errs)
{
  std::ostringstream ssin;
  ssin << sin.rdbuf();
  std::string doc = ssin.str();
  char const* begin = doc.data();
  char const* end = begin + doc.size();
  // Note that we do not actually need a null-terminator.
  CharReaderPtr const reader(fact.newCharReader());
  return reader->parse(begin, end, root, errs);
}